

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O0

Request * __thiscall
Post::PostFixture::parse(Request *__return_storage_ptr__,PostFixture *this,char *s,size_t size)

{
  ParseResult PVar1;
  ParseResult res;
  undefined1 local_e8 [8];
  HttpRequestParser parser;
  Request request;
  size_t size_local;
  char *s_local;
  PostFixture *this_local;
  
  httpparser::Request::Request((Request *)&parser.chunked);
  httpparser::HttpRequestParser::HttpRequestParser((HttpRequestParser *)local_e8);
  PVar1 = httpparser::HttpRequestParser::parse
                    ((HttpRequestParser *)local_e8,(Request *)&parser.chunked,s,s + size);
  if (PVar1 == ParsingCompleted) {
    httpparser::Request::Request(__return_storage_ptr__,(Request *)&parser.chunked);
  }
  else {
    httpparser::Request::Request(__return_storage_ptr__);
  }
  httpparser::HttpRequestParser::~HttpRequestParser((HttpRequestParser *)local_e8);
  httpparser::Request::~Request((Request *)&parser.chunked);
  return __return_storage_ptr__;
}

Assistant:

Request parse(const char *s, size_t size)
    {
        Request request;
        HttpRequestParser parser;
        
        HttpRequestParser::ParseResult res = parser.parse(request, s, s + size);
        
        if( res != HttpRequestParser::ParsingCompleted )
            return Request();
        else
            return request;
    }